

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCodeAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::KeyCode>::readValueFrom
          (TypedAttribute<Imf_2_5::KeyCode> *this,IStream *is,int size,int version)

{
  int in_EDX;
  KeyCode *in_RSI;
  int *in_RDI;
  int tmp;
  IStream *in_stack_ffffffffffffffe0;
  
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setFilmMfcCode(in_RSI,in_EDX);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setFilmType(in_RSI,in_EDX);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPrefix(in_RSI,in_EDX);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setCount(in_RSI,in_EDX);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPerfOffset(in_RSI,in_EDX);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPerfsPerFrame(in_RSI,in_EDX);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_ffffffffffffffe0,in_RDI);
  KeyCode::setPerfsPerCount(in_RSI,in_EDX);
  return;
}

Assistant:

void
KeyCodeAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    int tmp;

    Xdr::read <StreamIO> (is, tmp);
    _value.setFilmMfcCode (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setFilmType (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPrefix (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setCount (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPerfOffset (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPerfsPerFrame (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPerfsPerCount (tmp);
}